

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O2

vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
text_subtitles::TextSubtitlesRender::processTxtLine
          (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,TextSubtitlesRender *this,string *line,
          vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *fontStack)

{
  char cVar1;
  int iVar2;
  pointer ppVar3;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  TextSubtitlesRender *pTVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  wint_t wVar8;
  int32_t iVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  const_iterator cVar13;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  ulong uVar14;
  pointer ppVar15;
  size_type sVar16;
  pointer pFVar17;
  ulong uVar18;
  ulong local_110;
  string arg;
  string local_d8;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string tagStr;
  Font local_90;
  TextSubtitlesRender *local_58;
  string ltagStr;
  
  pFVar17 = (fontStack->
            super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if ((fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
      _M_impl.super__Vector_impl_data._M_start == pFVar17) {
    std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
              (fontStack,&this->m_font);
    ((fontStack->super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
     _M_impl.super__Vector_impl_data._M_start)->m_size = 3;
    pFVar17 = (fontStack->
              super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  local_58 = this;
  Font::Font(&local_90,pFVar17 + -1);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar14 = 0;
  bVar7 = false;
  uVar18 = 0;
  local_110 = 0;
  __range1 = __return_storage_ptr__;
  do {
    pTVar4 = local_58;
    this_00 = __range1;
    if (line->_M_string_length <= uVar14) {
      if ((local_110 & 0xffffffff) < line->_M_string_length) {
        std::__cxx11::string::substr((ulong)&tagStr,(ulong)line);
        std::
        vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
        ::emplace_back<text_subtitles::Font&,std::__cxx11::string>
                  ((vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
                    *)this_00,&local_90,&tagStr);
        std::__cxx11::string::~string((string *)&tagStr);
      }
      iVar2 = (pTVar4->m_initFont).m_size;
      ppVar3 = (this_00->
               super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar15 = (this_00->
                     super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar3;
          ppVar15 = ppVar15 + 1) {
        iVar10 = browserSizeToRealSize((ppVar15->first).m_size,(double)iVar2);
        (ppVar15->first).m_size = iVar10;
      }
      std::__cxx11::string::~string((string *)&local_90);
      return __range1;
    }
    cVar1 = (line->_M_dataplus)._M_p[uVar14];
    if (cVar1 == '<') {
      bVar7 = true;
      uVar18 = uVar14;
    }
    else if (cVar1 == '>') {
      if (bVar7) {
        std::__cxx11::string::substr((ulong)&ltagStr,(ulong)line);
        trimStr(&tagStr,&ltagStr);
        std::__cxx11::string::~string((string *)&ltagStr);
        std::__cxx11::string::string((string *)&ltagStr,(string *)&tagStr);
        sVar6 = ltagStr._M_string_length;
        _Var5 = ltagStr._M_dataplus;
        for (sVar16 = 0; sVar6 != sVar16; sVar16 = sVar16 + 1) {
          wVar8 = towlower((int)_Var5._M_p[sVar16]);
          _Var5._M_p[sVar16] = (char)wVar8;
        }
        bVar7 = std::operator==(&ltagStr,"i");
        if ((bVar7) || (bVar7 = std::operator==(&ltagStr,"italic"), bVar7)) {
          local_90.m_opts._0_1_ = (byte)local_90.m_opts | 2;
          bVar7 = true;
          goto LAB_001d890b;
        }
        bVar7 = std::operator==(&ltagStr,"b");
        if ((bVar7) || (bVar7 = std::operator==(&ltagStr,"bold"), bVar7)) {
          local_90.m_opts._0_1_ = (byte)local_90.m_opts | 1;
LAB_001d8908:
          bVar7 = true;
LAB_001d890b:
          if (local_110 < uVar18) {
            std::__cxx11::string::substr((ulong)&arg,(ulong)line);
            std::
            vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
            ::emplace_back<text_subtitles::Font&,std::__cxx11::string&>
                      ((vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
                        *)__range1,
                       (fontStack->
                       super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1,&arg);
            std::__cxx11::string::~string((string *)&arg);
          }
          if (bVar7) {
            std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
                      (fontStack,&local_90);
          }
          else {
            uVar11 = ((long)(fontStack->
                            super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(fontStack->
                           super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x38;
            if (1 < uVar11) {
              std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::resize
                        (fontStack,uVar11 - 1);
              Font::operator=(&local_90,
                              (fontStack->
                              super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1);
            }
          }
          local_110 = uVar14 + 1;
        }
        else {
          bVar7 = std::operator==(&ltagStr,"u");
          if ((bVar7) || (bVar7 = std::operator==(&ltagStr,"underline"), bVar7)) {
            local_90.m_opts._0_1_ = (byte)local_90.m_opts | 4;
            goto LAB_001d8908;
          }
          bVar7 = std::operator==(&ltagStr,"f");
          if ((bVar7) || (bVar7 = std::operator==(&ltagStr,"force"), bVar7)) {
            local_90.m_opts._0_1_ = (byte)local_90.m_opts | 0x10;
            goto LAB_001d8908;
          }
          bVar7 = std::operator==(&ltagStr,"strike");
          if (bVar7) {
            local_90.m_opts._0_1_ = (byte)local_90.m_opts | 8;
            goto LAB_001d8908;
          }
          bVar7 = std::operator==(&ltagStr,"/i");
          if (((((bVar7) || (bVar7 = std::operator==(&ltagStr,"/italic"), bVar7)) ||
               (bVar7 = std::operator==(&ltagStr,"/b"), bVar7)) ||
              ((bVar7 = std::operator==(&ltagStr,"/bold"), bVar7 ||
               (bVar7 = std::operator==(&ltagStr,"/u"), bVar7)))) ||
             ((bVar7 = std::operator==(&ltagStr,"/underline"), bVar7 ||
              (bVar7 = std::operator==(&ltagStr,"/f"), bVar7)))) {
            bVar7 = false;
            goto LAB_001d890b;
          }
          bVar7 = std::operator==(&ltagStr,"/force");
          if (bVar7) {
            bVar7 = false;
            goto LAB_001d890b;
          }
          bVar7 = std::operator==(&ltagStr,"/strike");
          if (bVar7) {
LAB_001d8b45:
            bVar7 = false;
            goto LAB_001d890b;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&arg,"/font",(allocator<char> *)&local_d8);
          bVar7 = strStartWith(&tagStr,&arg);
          std::__cxx11::string::~string((string *)&arg);
          if (bVar7) goto LAB_001d8b45;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&arg,"font ",(allocator<char> *)&local_d8);
          bVar7 = strStartWith(&ltagStr,&arg);
          std::__cxx11::string::~string((string *)&arg);
          if (bVar7) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&arg,"name",(allocator<char> *)&local_d8);
            sVar12 = anon_unknown.dwarf_2629b6::findUnquotedStr(&ltagStr,&arg);
            std::__cxx11::string::~string((string *)&arg);
            if (sVar12 == 0xffffffffffffffff) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&arg,"face",(allocator<char> *)&local_d8);
              sVar12 = anon_unknown.dwarf_2629b6::findUnquotedStr(&ltagStr,&arg);
              std::__cxx11::string::~string((string *)&arg);
              if (sVar12 != 0xffffffffffffffff) goto LAB_001d8bfb;
            }
            else {
LAB_001d8bfb:
              findFontArg(&local_d8,&tagStr,sVar12);
              unquoteStr(&arg,&local_d8);
              std::__cxx11::string::operator=((string *)&local_90,(string *)&arg);
              std::__cxx11::string::~string((string *)&arg);
              std::__cxx11::string::~string((string *)&local_d8);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&arg,"color",(allocator<char> *)&local_d8);
            sVar12 = anon_unknown.dwarf_2629b6::findUnquotedStr(&ltagStr,&arg);
            std::__cxx11::string::~string((string *)&arg);
            if (sVar12 != 0xffffffffffffffff) {
              findFontArg(&local_d8,&ltagStr,sVar12);
              unquoteStr(&arg,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              cVar13 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)(anonymous_namespace)::defaultPallette_abi_cxx11_,&arg);
              if (cVar13.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  ._M_cur != (__node_type *)0x0) {
                local_90.m_color =
                     *(uint32_t *)
                      ((long)cVar13.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                             ._M_cur + 0x28);
                if (arg._M_string_length == 0) {
LAB_001d8d3d:
                  local_90.m_color = strToInt32u(arg._M_dataplus._M_p,10);
                }
                else {
                  cVar1 = *arg._M_dataplus._M_p;
                  if ((cVar1 == 'x') || (cVar1 == '#')) {
                    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&arg);
                    local_90.m_color = strToInt32u(local_d8._M_dataplus._M_p,0x10);
                  }
                  else {
                    if ((arg._M_string_length == 1) ||
                       ((cVar1 != '0' && (arg._M_dataplus._M_p[1] != 'x')))) goto LAB_001d8d3d;
                    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&arg);
                    local_90.m_color = strToInt32u(local_d8._M_dataplus._M_p,0x10);
                  }
                  std::__cxx11::string::~string((string *)&local_d8);
                }
              }
              if (local_90.m_color < 0x1000000) {
                local_90.m_color = local_90.m_color | 0xff000000;
              }
              std::__cxx11::string::~string((string *)&arg);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&arg,"size",(allocator<char> *)&local_d8);
            sVar12 = anon_unknown.dwarf_2629b6::findUnquotedStr(&ltagStr,&arg);
            std::__cxx11::string::~string((string *)&arg);
            bVar7 = true;
            if (sVar12 != 0xffffffffffffffff) {
              findFontArg(&local_d8,&tagStr,sVar12);
              unquoteStr(&arg,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              if (arg._M_string_length != 0) {
                if ((*arg._M_dataplus._M_p == '-') || (*arg._M_dataplus._M_p == '+')) {
                  iVar9 = strToInt32(arg._M_dataplus._M_p,10);
                  local_90.m_size = iVar9 + local_90.m_size;
                }
                else {
                  local_90.m_size = strToInt32(arg._M_dataplus._M_p,10);
                }
              }
              std::__cxx11::string::~string((string *)&arg);
              bVar7 = true;
            }
            goto LAB_001d890b;
          }
        }
        std::__cxx11::string::~string((string *)&ltagStr);
        std::__cxx11::string::~string((string *)&tagStr);
      }
      bVar7 = false;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

vector<pair<Font, string>> TextSubtitlesRender::processTxtLine(const std::string& line, vector<Font>& fontStack) const
{
    if (fontStack.empty())
    {
        fontStack.push_back(m_font);
        fontStack[0].m_size = DEFAULT_BROWSER_STYLE_FS;
    }
    Font curFont = fontStack[fontStack.size() - 1];

    vector<pair<Font, string>> rez;
    size_t prevTextPos = 0;
    size_t bStartPos = 0;
    bool bStartFound = false;
    for (size_t i = 0; i < line.size(); i++)
    {
        if (line[i] == '<')
        {
            bStartPos = i;
            bStartFound = true;
        }
        else if (line[i] == '>' && bStartFound)
        {
            bool isTag = false;
            bool endTag = false;
            string tagStr = trimStr(line.substr(bStartPos + 1, i - bStartPos - 1));
            string ltagStr = tagStr;
            for (auto& j : ltagStr) j = static_cast<char>(towlower(j));
            if (ltagStr == "i" || ltagStr == "italic")
            {
                curFont.m_opts |= Font::ITALIC;
                isTag = true;
            }
            else if (ltagStr == "b" || ltagStr == "bold")
            {
                curFont.m_opts |= Font::BOLD;
                isTag = true;
            }
            else if (ltagStr == "u" || ltagStr == "underline")
            {
                curFont.m_opts |= Font::UNDERLINE;
                isTag = true;
            }
            else if (ltagStr == "f" || ltagStr == "force")
            {
                curFont.m_opts |= Font::FORCED;
                isTag = true;
            }
            else if (ltagStr == "strike")
            {
                curFont.m_opts |= Font::STRIKE_OUT;
                isTag = true;
            }
            else if ((ltagStr == "/i" || ltagStr == "/italic") || (ltagStr == "/b" || ltagStr == "/bold") ||
                     (ltagStr == "/u" || ltagStr == "/underline") || (ltagStr == "/f" || ltagStr == "/force") ||
                     ltagStr == "/strike" || strStartWith(tagStr, "/font"))
            {
                endTag = true;
            }
            else if (strStartWith(ltagStr, "font "))
            {
                size_t fontNamePos = findUnquotedStr(ltagStr, "name");  // ltagStr.find("name");
                if (fontNamePos == string::npos)
                    fontNamePos = findUnquotedStr(ltagStr, "face");
                if (fontNamePos != string::npos)
                    curFont.m_name = unquoteStr(findFontArg(tagStr, fontNamePos /*, lastIndexPos*/));

                size_t colorPos = findUnquotedStr(ltagStr, "color");
                if (colorPos != string::npos)
                {
                    auto arg = unquoteStr(findFontArg(ltagStr, colorPos));
                    auto it = defaultPallette.find(arg);
                    if (it != std::end(defaultPallette))
                    {
                        curFont.m_color = it->second;
                        if (!arg.empty() && (arg[0] == '#' || arg[0] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(1, 16384).c_str(), 16);
                        else if (arg.size() > 1 && (arg[0] == '0' || arg[1] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(2, 16384).c_str(), 16);
                        else
                            curFont.m_color = strToInt32u(arg.c_str(), 10);
                    }
                    if ((curFont.m_color & 0xff000000u) == 0)
                        curFont.m_color |= 0xff000000u;
                }
                size_t fontSizePos = findUnquotedStr(ltagStr, "size");
                if (fontSizePos != string::npos)
                {
                    string arg = unquoteStr(findFontArg(tagStr, fontSizePos));
                    if (!arg.empty())
                    {
                        if (arg[0] == '+' || arg[0] == '-')
                            curFont.m_size += strToInt32(arg.c_str(), 10);
                        else
                            curFont.m_size = strToInt32(arg.c_str(), 10);
                    }
                }
                isTag = true;
            }
            if (isTag || endTag)
            {
                if (bStartPos > prevTextPos)
                {
                    string msg = line.substr(prevTextPos, bStartPos - prevTextPos);
                    rez.emplace_back(fontStack[fontStack.size() - 1], msg);
                }
                if (isTag)
                    fontStack.push_back(curFont);
                else if (fontStack.size() > 1)
                {
                    fontStack.resize(fontStack.size() - 1);
                    curFont = fontStack[fontStack.size() - 1];
                }
                prevTextPos = i + 1;
            }
            bStartFound = false;
        }
    }
    if (line.size() > static_cast<unsigned>(prevTextPos))
        rez.emplace_back(curFont, line.substr(prevTextPos, line.size() - prevTextPos));
    double rSize = m_initFont.m_size;
    for (auto& i : rez) i.first.m_size = browserSizeToRealSize(i.first.m_size, rSize);
    return rez;
}